

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Sampler
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  bool bVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  string sStack_108;
  ParameterDictionary local_e8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_e8,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  if (this->upgrade == true) {
    bVar1 = std::operator==(name,"lowdiscrepancy");
    if (!bVar1) {
      bVar1 = std::operator==(name,"02sequence");
      if (!bVar1) {
        bVar1 = std::operator==(name,"maxmindist");
        if (bVar1) {
          indent_abi_cxx11_(&sStack_108,this,0);
          Printf<std::__cxx11::string>("%sSampler \"pmj02bn\"\n",&sStack_108);
        }
        else {
          indent_abi_cxx11_(&sStack_108,this,0);
          Printf<std::__cxx11::string,std::__cxx11::string_const&>
                    ("%sSampler \"%s\"\n",&sStack_108,name);
        }
        goto LAB_003492b4;
      }
    }
    indent_abi_cxx11_(&sStack_108,this,0);
    Printf<std::__cxx11::string>("%sSampler \"paddedsobol\"\n",&sStack_108);
  }
  else {
    indent_abi_cxx11_(&sStack_108,this,0);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sSampler \"%s\"\n",&sStack_108,name);
  }
LAB_003492b4:
  std::__cxx11::string::~string((string *)&sStack_108);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&sStack_108,&local_e8,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::operator<<((ostream *)&std::cout,(string *)&sStack_108);
  std::__cxx11::string::~string((string *)&sStack_108);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_e8.params);
  return;
}

Assistant:

void FormattingScene::Sampler(const std::string &name, ParsedParameterVector params,
                              FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    if (upgrade) {
        if (name == "lowdiscrepancy" || name == "02sequence")
            Printf("%sSampler \"paddedsobol\"\n", indent());
        else if (name == "maxmindist")
            Printf("%sSampler \"pmj02bn\"\n", indent());
        else
            Printf("%sSampler \"%s\"\n", indent(), name);
    } else
        Printf("%sSampler \"%s\"\n", indent(), name);
    std::cout << dict.ToParameterList(catIndentCount);
}